

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

MultiIndexSet * __thiscall
TasGrid::GridWavelet::getRefinementCanidates
          (MultiIndexSet *__return_storage_ptr__,GridWavelet *this,double tolerance,
          TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits)

{
  MultiIndexSet *this_00;
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int j;
  int iVar8;
  int i_00;
  int *p;
  long lVar9;
  pointer piVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  Data2D<int> addons;
  Data2D<int> refined;
  Data2D<int> pmap;
  vector<int,_std::allocator<int>_> parent;
  
  buildUpdateMap(&pmap,this,tolerance,criteria,output);
  uVar12 = 0;
  Data2D<int>::Data2D<int,int>(&refined,(this->super_BaseCanonicalGrid).num_dimensions,0);
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  if (0 < (int)uVar1) {
    uVar12 = (ulong)uVar1;
  }
  if ((level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar7 = 0;
    for (uVar11 = 0;
        piVar2 = pmap.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar11 != uVar12; uVar11 = uVar11 + 1) {
      lVar9 = pmap.stride * lVar7;
      for (lVar13 = 0; lVar13 < (this->super_BaseCanonicalGrid).num_dimensions; lVar13 = lVar13 + 1)
      {
        if ((*(int *)((long)piVar2 + lVar13 * 4 + lVar9) == 1) &&
           (((criteria & ~refine_direction_selective) != refine_parents_first ||
            (bVar3 = addParent(this,(this->super_BaseCanonicalGrid).points.indexes.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                                    (this->super_BaseCanonicalGrid).points.num_dimensions * uVar11,
                               (int)lVar13,&refined), !bVar3)))) {
          addChild(this,(this->super_BaseCanonicalGrid).points.indexes.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (this->super_BaseCanonicalGrid).points.num_dimensions * uVar11,(int)lVar13,
                   &refined);
        }
      }
      lVar7 = lVar7 + 4;
    }
  }
  else {
    lVar7 = 0;
    for (uVar11 = 0;
        piVar2 = pmap.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar11 != uVar12; uVar11 = uVar11 + 1) {
      lVar13 = pmap.stride * lVar7;
      for (lVar9 = 0; lVar9 < (this->super_BaseCanonicalGrid).num_dimensions; lVar9 = lVar9 + 1) {
        if ((*(int *)((long)piVar2 + lVar9 * 4 + lVar13) == 1) &&
           (((criteria & ~refine_direction_selective) != refine_parents_first ||
            (bVar3 = addParent(this,(this->super_BaseCanonicalGrid).points.indexes.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                                    (this->super_BaseCanonicalGrid).points.num_dimensions * uVar11,
                               (int)lVar9,&refined), !bVar3)))) {
          addChildLimited(this,(this->super_BaseCanonicalGrid).points.indexes.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start +
                               (this->super_BaseCanonicalGrid).points.num_dimensions * uVar11,
                          (int)lVar9,level_limits,&refined);
        }
      }
      lVar7 = lVar7 + 4;
    }
  }
  if ((int)refined.num_strips < 1) {
    __return_storage_ptr__->num_dimensions = 0;
    __return_storage_ptr__->cache_num_indexes = 0;
    (__return_storage_ptr__->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    MultiIndexSet::MultiIndexSet(__return_storage_ptr__,&refined);
  }
  if (criteria == refine_stable) {
    this_00 = &(this->super_BaseCanonicalGrid).points;
    iVar8 = 1;
    while (iVar8 != 0) {
      Data2D<int>::Data2D<int,int>(&addons,(this->super_BaseCanonicalGrid).num_dimensions,0);
      iVar4 = __return_storage_ptr__->cache_num_indexes;
      i_00 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (; iVar8 = (int)addons.num_strips, i_00 != iVar4; i_00 = i_00 + 1) {
        MultiIndexSet::copyIndex(&parent,__return_storage_ptr__,i_00);
        piVar2 = parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar10 = parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar10 != piVar2; piVar10 = piVar10 + 1) {
          iVar8 = *piVar10;
          iVar5 = RuleWavelet::getParent(&this->rule1D,iVar8);
          *piVar10 = iVar5;
          if (-1 < iVar5) {
            bVar3 = MultiIndexSet::missing(__return_storage_ptr__,&parent);
            if ((bVar3) && (bVar3 = MultiIndexSet::missing(this_00,&parent), bVar3)) {
              Data2D<int>::appendStrip(&addons,&parent);
            }
            iVar5 = *piVar10;
          }
          if (iVar5 == -2) {
            for (iVar5 = 0; iVar6 = RuleWavelet::getNumPoints(&this->rule1D,0), iVar5 < iVar6;
                iVar5 = iVar5 + 1) {
              *piVar10 = iVar5;
              bVar3 = MultiIndexSet::missing(__return_storage_ptr__,&parent);
              if ((bVar3) && (bVar3 = MultiIndexSet::missing(this_00,&parent), bVar3)) {
                Data2D<int>::appendStrip(&addons,&parent);
              }
            }
          }
          *piVar10 = iVar8;
        }
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&parent);
      }
      if ((int)addons.num_strips != 0) {
        MultiIndexSet::MultiIndexSet((MultiIndexSet *)&parent,&addons);
        MultiIndexSet::operator+=(__return_storage_ptr__,(MultiIndexSet *)&parent);
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)
                   &parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&addons.vec.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&refined.vec.super__Vector_base<int,_std::allocator<int>_>);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&pmap.vec.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridWavelet::getRefinementCanidates(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits) const{
    Data2D<int> pmap = buildUpdateMap(tolerance, criteria, output);

    bool useParents = (criteria == refine_fds) || (criteria == refine_parents_first);

    Data2D<int> refined(num_dimensions, 0);

    int num_points = points.getNumIndexes();

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent(points.getIndex(i), j, lrefined))){
                            addChild(points.getIndex(i), j, lrefined);
                        }
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent(points.getIndex(i), j, lrefined))){
                            addChildLimited(points.getIndex(i), j, level_limits, lrefined);
                        }
                    }
                }
            }
        }

        #pragma omp critical
        {
            refined.append(lrefined);
        }
    }
    #else
    if (level_limits.empty()){
        for(int i=0; i<num_points; i++){
            int *p = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (p[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent(points.getIndex(i), j, refined))){
                        addChild(points.getIndex(i), j, refined);
                    }
                }
            }
        }
    }else{
        for(int i=0; i<num_points; i++){
            int *p = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (p[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent(points.getIndex(i), j, refined))){
                        addChildLimited(points.getIndex(i), j, level_limits, refined);
                    }
                }
            }
        }
    }
    #endif

    MultiIndexSet result = (refined.getNumStrips() > 0) ? MultiIndexSet(refined) : MultiIndexSet();

    if (criteria == refine_stable){ // complete needed to a lower set
        size_t num_added = 1; // set to 1 to start the loop
        while(num_added > 0){
            Data2D<int> addons(num_dimensions, 0);
            int num_needed = result.getNumIndexes();

            for(int i=0; i<num_needed; i++){
                std::vector<int> parent = result.copyIndex(i);
                for(auto &p : parent){
                    int r = p;
                    p = rule1D.getParent(r);
                    if ((p > -1) && result.missing(parent) && points.missing(parent))
                        addons.appendStrip(parent);
                    if (p == -2){ // all parents on level 0
                        for(int j=0; j<rule1D.getNumPoints(0); j++){
                            p = j;
                            if (result.missing(parent) && points.missing(parent))
                                addons.appendStrip(parent);
                        }
                    }
                    p = r;
                }
            }

            num_added = addons.getNumStrips();
            if (num_added > 0)
                result += addons;
        }
    }

    return result;
}